

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkVertexInputRate Diligent::LayoutElemFrequencyToVkInputRate(INPUT_ELEMENT_FREQUENCY frequency)

{
  VkVertexInputRate VVar1;
  int iVar2;
  undefined7 in_register_00000039;
  string msg;
  
  iVar2 = (int)CONCAT71(in_register_00000039,frequency);
  if (iVar2 == 2) {
    VVar1 = VK_VERTEX_INPUT_RATE_INSTANCE;
  }
  else {
    VVar1 = VK_VERTEX_INPUT_RATE_VERTEX;
    if (iVar2 != 1) {
      if (iVar2 == 0) {
        FormatString<char[35]>(&msg,(char (*) [35])"Undefined layout element frequency");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"LayoutElemFrequencyToVkInputRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x3dc);
      }
      else {
        FormatString<char[33]>(&msg,(char (*) [33])"Unknown layout element frequency");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"LayoutElemFrequencyToVkInputRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x3e3);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return VVar1;
}

Assistant:

VkVertexInputRate LayoutElemFrequencyToVkInputRate(INPUT_ELEMENT_FREQUENCY frequency)
{
    switch (frequency)
    {
        case INPUT_ELEMENT_FREQUENCY_UNDEFINED:
            UNEXPECTED("Undefined layout element frequency");
            return VK_VERTEX_INPUT_RATE_VERTEX;

        case INPUT_ELEMENT_FREQUENCY_PER_VERTEX: return VK_VERTEX_INPUT_RATE_VERTEX;
        case INPUT_ELEMENT_FREQUENCY_PER_INSTANCE: return VK_VERTEX_INPUT_RATE_INSTANCE;

        default:
            UNEXPECTED("Unknown layout element frequency");
            return VK_VERTEX_INPUT_RATE_VERTEX;
    }
}